

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> * __thiscall
testing::internal::
linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_>::operator=
          (linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> *this,
          linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> *ptr)

{
  linked_ptr_internal *this_00;
  MatcherInterface<fmt::v5::basic_string_view<wchar_t>_> *pMVar1;
  bool bVar2;
  
  if (ptr != this) {
    this_00 = &this->link_;
    bVar2 = linked_ptr_internal::depart(this_00);
    if ((bVar2) && (this->value_ != (MatcherInterface<fmt::v5::basic_string_view<wchar_t>_> *)0x0))
    {
      (*(this->value_->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[1])();
    }
    pMVar1 = ptr->value_;
    this->value_ = pMVar1;
    if (pMVar1 == (MatcherInterface<fmt::v5::basic_string_view<wchar_t>_> *)0x0) {
      this_00->next_ = this_00;
    }
    else {
      linked_ptr_internal::join(this_00,&ptr->link_);
    }
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }